

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddPerm(Abc_ZddMan *p,int a,int Var)

{
  int iVar1;
  int j;
  int iVar2;
  int iVar3;
  int iVar4;
  int j_00;
  long lVar5;
  Abc_ZddObj *pAVar6;
  uint uVar7;
  
  if (p->nVars <= Var) {
    __assert_fail("Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                  ,0x223,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
  }
  if (a == 0) {
    return 0;
  }
  if (a == 1) {
    return Var + 2;
  }
  iVar2 = Abc_ZddCacheLookup(p,a,Var,5);
  if (-1 < iVar2) {
    return iVar2;
  }
  uVar7 = *(uint *)(p->pObjs + a) & 0x7fffffff;
  iVar2 = p->pV2TI[uVar7];
  lVar5 = (long)Var;
  iVar3 = p->pV2TI[lVar5];
  if (iVar3 < iVar2) {
    iVar3 = 0;
    uVar7 = Var;
    iVar2 = a;
LAB_003783aa:
    iVar2 = Abc_ZddUniqueCreate(p,uVar7,iVar2,iVar3);
  }
  else {
    pAVar6 = p->pObjs + a;
    if (uVar7 == Var) {
      iVar3 = Abc_ZddPerm(p,pAVar6->False,Var);
      uVar7 = pAVar6->True;
    }
    else {
      iVar1 = p->pV2TJ[uVar7];
      if ((iVar1 <= iVar2) || (j = p->pV2TJ[lVar5], j <= iVar3)) {
        __assert_fail("Ai < Aj && Bi < Bj && Ai <= Bi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x235,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      j_00 = j;
      iVar4 = Var;
      if ((iVar1 == iVar3) || (j_00 = iVar3, iVar1 == j)) {
        uVar7 = Abc_ZddVarIJ(p,iVar2,j_00);
      }
      else if (iVar2 == iVar3) {
        iVar2 = j;
        if (iVar1 < j) {
          iVar2 = iVar1;
        }
        if (j < iVar1) {
          j = iVar1;
        }
        iVar4 = Abc_ZddVarIJ(p,iVar2,j);
        uVar7 = *(uint *)pAVar6 & 0x7fffffff;
        lVar5 = (long)iVar4;
      }
      if (p->pV2TI[lVar5] <= p->pV2TI[(int)uVar7]) {
        __assert_fail("p->pV2TI[VarPerm] > p->pV2TI[VarTop]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x242,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      iVar3 = Abc_ZddPerm(p,pAVar6->False,Var);
      iVar2 = Abc_ZddPerm(p,pAVar6->True,iVar4);
      if ((int)(*(uint *)(p->pObjs + iVar2) & 0x7fffffff) <= (int)uVar7) {
        __assert_fail("Abc_ZddObjVar(p, r1) > VarTop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x245,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      if ((int)uVar7 < (int)(*(uint *)(p->pObjs + iVar3) & 0x7fffffff)) goto LAB_003783aa;
      uVar7 = Abc_ZddUniqueCreate(p,uVar7,iVar2,0);
    }
    iVar2 = Abc_ZddUnion(p,iVar3,uVar7);
  }
  Abc_ZddCacheInsert(p,a,Var,5,iVar2);
  return iVar2;
}

Assistant:

int Abc_ZddPerm( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    assert( Var < p->nVars );
    if ( a == 0 )  return 0;
    if ( a == 1 )  return Abc_ZddIthVar(Var);
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_PERM)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    if ( p->pV2TI[A->Var] > p->pV2TI[Var] ) // Ai > Bi
        r = Abc_ZddUniqueCreate( p, Var, a, 0 );
    else if ( (int)A->Var == Var ) // Ai == Bi && Aj == Bj
        r0 = Abc_ZddPerm( p, A->False, Var ), 
        r  = Abc_ZddUnion( p, r0, A->True );
    else 
    {
        int VarPerm, VarTop;
        int Ai = p->pV2TI[A->Var];
        int Aj = p->pV2TJ[A->Var];
        int Bi = p->pV2TI[Var];
        int Bj = p->pV2TJ[Var];
        assert( Ai < Aj && Bi < Bj && Ai <= Bi );
        if ( Aj == Bi )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bj);
        else if ( Aj == Bj )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bi);
        else if ( Ai == Bi )
            VarPerm = Abc_ZddVarIJ(p, Abc_MinInt(Aj, Bj), Abc_MaxInt(Aj, Bj)),
            VarTop  = A->Var;
        else // no clash
            VarPerm = Var, 
            VarTop  = A->Var;
        assert( p->pV2TI[VarPerm] > p->pV2TI[VarTop] );
        r0 = Abc_ZddPerm( p, A->False, Var ); 
        r1 = Abc_ZddPerm( p, A->True, VarPerm );
        assert( Abc_ZddObjVar(p, r1) > VarTop );
        if ( Abc_ZddObjVar(p, r0) > VarTop )
            r = Abc_ZddUniqueCreate( p, VarTop, r1, r0 );
        else
            r1 = Abc_ZddUniqueCreate( p, VarTop, r1, 0 ),
            r = Abc_ZddUnion( p, r0, r1 );
    }
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_PERM, r );
}